

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_quad_mesh.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx::QuadMeshISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,QuadMeshISA *this,mvector<PrimRef> *prims,size_t itime,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  long lVar1;
  BufferView<embree::Vec3fa> *pBVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  PrimRef *pPVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  undefined4 uVar15;
  size_t sVar16;
  ulong uVar17;
  unsigned_long uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  undefined1 auVar28 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar23 [64];
  undefined1 auVar25 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar17 = r->_begin;
  uVar18 = r->_end;
  if (uVar17 < uVar18) {
    auVar22._8_4_ = 0xff800000;
    auVar22._0_8_ = 0xff800000ff800000;
    auVar22._12_4_ = 0xff800000;
    auVar23 = ZEXT1664(auVar22);
    auVar24._8_4_ = 0x7f800000;
    auVar24._0_8_ = 0x7f8000007f800000;
    auVar24._12_4_ = 0x7f800000;
    auVar25 = ZEXT1664(auVar24);
    sVar12 = 0;
    auVar32._8_4_ = 0xddccb9a2;
    auVar32._0_8_ = 0xddccb9a2ddccb9a2;
    auVar32._12_4_ = 0xddccb9a2;
    auVar33._8_4_ = 0x5dccb9a2;
    auVar33._0_8_ = 0x5dccb9a25dccb9a2;
    auVar33._12_4_ = 0x5dccb9a2;
    auVar28 = ZEXT1664(auVar24);
    auVar31 = ZEXT1664(auVar22);
    do {
      lVar1 = *(long *)&(this->super_QuadMesh).super_Geometry.field_0x58;
      pBVar2 = (this->super_QuadMesh).vertices.items;
      lVar13 = *(long *)&(this->super_QuadMesh).field_0x68 * uVar17;
      uVar19 = (ulong)*(uint *)(lVar1 + lVar13);
      uVar3 = (pBVar2->super_RawBufferView).num;
      sVar16 = k;
      if ((((uVar19 < uVar3) && (uVar21 = (ulong)*(uint *)(lVar1 + 4 + lVar13), uVar21 < uVar3)) &&
          (uVar20 = (ulong)*(uint *)(lVar1 + 8 + lVar13), uVar20 < uVar3)) &&
         (uVar14 = (ulong)*(uint *)(lVar1 + 0xc + lVar13), uVar14 < uVar3)) {
        pcVar4 = pBVar2[itime].super_RawBufferView.ptr_ofs;
        sVar5 = pBVar2[itime].super_RawBufferView.stride;
        auVar22 = *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar19);
        auVar24 = vcmpps_avx(auVar22,auVar32,6);
        auVar34 = vcmpps_avx(auVar22,auVar33,1);
        auVar24 = vandps_avx(auVar24,auVar34);
        uVar15 = vmovmskps_avx(auVar24);
        if ((~(byte)uVar15 & 7) == 0) {
          auVar24 = *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar21);
          auVar34 = vcmpps_avx(auVar24,auVar32,6);
          auVar7 = vcmpps_avx(auVar24,auVar33,1);
          auVar34 = vandps_avx(auVar34,auVar7);
          uVar15 = vmovmskps_avx(auVar34);
          if ((~(byte)uVar15 & 7) == 0) {
            auVar34 = *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar20);
            auVar7 = vcmpps_avx(auVar34,auVar32,6);
            auVar8 = vcmpps_avx(auVar34,auVar33,1);
            auVar7 = vandps_avx(auVar7,auVar8);
            uVar15 = vmovmskps_avx(auVar7);
            if ((~(byte)uVar15 & 7) == 0) {
              auVar7 = *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar14);
              auVar8 = vcmpps_avx(auVar7,auVar32,6);
              auVar9 = vcmpps_avx(auVar7,auVar33,1);
              auVar8 = vandps_avx(auVar8,auVar9);
              uVar15 = vmovmskps_avx(auVar8);
              if ((~(byte)uVar15 & 7) == 0) {
                pcVar4 = pBVar2[itime + 1].super_RawBufferView.ptr_ofs;
                sVar5 = pBVar2[itime + 1].super_RawBufferView.stride;
                auVar8 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + uVar19 * sVar5),auVar32,6);
                auVar9 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + uVar19 * sVar5),auVar33,1);
                auVar8 = vandps_avx(auVar8,auVar9);
                uVar15 = vmovmskps_avx(auVar8);
                if ((~(byte)uVar15 & 7) == 0) {
                  auVar8 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + uVar21 * sVar5),auVar32,6);
                  auVar9 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + uVar21 * sVar5),auVar33,1);
                  auVar8 = vandps_avx(auVar8,auVar9);
                  uVar15 = vmovmskps_avx(auVar8);
                  if ((~(byte)uVar15 & 7) == 0) {
                    auVar8 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + uVar20 * sVar5),auVar32,6);
                    auVar9 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + uVar20 * sVar5),auVar33,1);
                    auVar8 = vandps_avx(auVar8,auVar9);
                    uVar15 = vmovmskps_avx(auVar8);
                    if ((~(byte)uVar15 & 7) == 0) {
                      auVar8 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar14),auVar32,6)
                      ;
                      auVar9 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar14),auVar33,1)
                      ;
                      auVar8 = vandps_avx(auVar8,auVar9);
                      uVar15 = vmovmskps_avx(auVar8);
                      if ((~(byte)uVar15 & 7) == 0) {
                        auVar8 = vminps_avx(auVar22,auVar24);
                        auVar9 = vminps_avx(auVar34,auVar7);
                        auVar8 = vminps_avx(auVar8,auVar9);
                        aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                  )vinsertps_avx(auVar8,ZEXT416(geomID),0x30);
                        auVar22 = vmaxps_avx(auVar22,auVar24);
                        auVar24 = vmaxps_avx(auVar34,auVar7);
                        auVar22 = vmaxps_avx(auVar22,auVar24);
                        aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                  )vinsertps_avx(auVar22,ZEXT416((uint)uVar17),0x30);
                        auVar22 = vminps_avx(auVar25._0_16_,(undefined1  [16])aVar10);
                        auVar25 = ZEXT1664(auVar22);
                        auVar22 = vmaxps_avx(auVar23._0_16_,(undefined1  [16])aVar11);
                        auVar23 = ZEXT1664(auVar22);
                        auVar34._0_4_ = aVar10.x + aVar11.x;
                        auVar34._4_4_ = aVar10.y + aVar11.y;
                        auVar34._8_4_ = aVar10.z + aVar11.z;
                        auVar34._12_4_ = aVar10.field_3.w + aVar11.field_3.w;
                        auVar22 = vminps_avx(auVar28._0_16_,auVar34);
                        auVar28 = ZEXT1664(auVar22);
                        auVar22 = vmaxps_avx(auVar31._0_16_,auVar34);
                        auVar31 = ZEXT1664(auVar22);
                        sVar12 = sVar12 + 1;
                        sVar16 = k + 1;
                        pPVar6 = prims->items;
                        pPVar6[k].lower.field_0.field_1 = aVar10;
                        pPVar6[k].upper.field_0.field_1 = aVar11;
                        uVar18 = r->_end;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      aVar29 = auVar31._0_16_;
      aVar26 = auVar28._0_16_;
      aVar30 = auVar23._0_16_;
      aVar27 = auVar25._0_16_;
      uVar17 = uVar17 + 1;
      k = sVar16;
    } while (uVar17 < uVar18);
  }
  else {
    aVar27.m128[2] = INFINITY;
    aVar27._0_8_ = 0x7f8000007f800000;
    aVar27.m128[3] = INFINITY;
    aVar30.m128[2] = -INFINITY;
    aVar30._0_8_ = 0xff800000ff800000;
    aVar30.m128[3] = -INFINITY;
    sVar12 = 0;
    aVar26 = aVar27;
    aVar29 = aVar30;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar27;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar30;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar26;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar29;
  __return_storage_ptr__->end = sVar12;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,itime,bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }